

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O0

int os_gen_temp_filename(char *buf,size_t buflen)

{
  int __fd;
  size_t in_RSI;
  char *in_RDI;
  int fd;
  char *tmp;
  char *local_20;
  int local_4;
  
  local_20 = getenv("TMPDIR");
  if (local_20 == (char *)0x0) {
    local_20 = "/tmp";
  }
  if (local_20 == (char *)0x0) {
    local_4 = 0;
  }
  else {
    snprintf(in_RDI,in_RSI,"%s/tads-XXXXXX",local_20);
    __fd = mkstemp(in_RDI);
    if (__fd < 0) {
      local_4 = 0;
    }
    else {
      close(__fd);
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int
os_gen_temp_filename( char* buf, size_t buflen )
{
    // Get the temporary directory: use the environment variable TMPDIR
    // if it's defined, otherwise use P_tmpdir; if even that's not
    // defined, return failure.
    const char* tmp = getenv("TMPDIR");
    if (tmp == 0)
        tmp = P_tmpdir;
    if (tmp == 0)
        return false;

    // Build a template filename for mkstemp.
    snprintf(buf, buflen, "%s/tads-XXXXXX", tmp);

    // Generate a unique name and open the file.
    int fd = mkstemp(buf);
    if (fd >= 0) {
        // Got it - close the placeholder file and return success.
        close(fd);
        return true;
    }
    // Failed.
    return false;
}